

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_EditionDefaultsInvalidMaximumEmpty_Test::
CommandLineInterfaceTest_EditionDefaultsInvalidMaximumEmpty_Test
          (CommandLineInterfaceTest_EditionDefaultsInvalidMaximumEmpty_Test *this)

{
  CommandLineInterfaceTest_EditionDefaultsInvalidMaximumEmpty_Test *this_local;
  
  CommandLineInterfaceTest::CommandLineInterfaceTest(&this->super_CommandLineInterfaceTest);
  (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)&PTR__CommandLineInterfaceTest_EditionDefaultsInvalidMaximumEmpty_Test_029fb920
  ;
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, EditionDefaultsInvalidMaximumEmpty) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  Run("protocol_compiler --proto_path=$tmpdir "
      "--edition_defaults_maximum= "
      "google/protobuf/descriptor.proto");
  ExpectErrorSubstring("unknown edition \"\"");
}